

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

string * __thiscall
punky::obj::inspect_abi_cxx11_(string *__return_storage_ptr__,obj *this,Object *obj)

{
  variant_alternative_t<4UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
  *pvVar1;
  variant_alternative_t<2UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
  *pvVar2;
  variant_alternative_t<1UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
  *pvVar3;
  variant_alternative_t<5UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
  *pvVar4;
  Object *obj_00;
  char *__s;
  any local_50;
  Object local_40;
  
  switch(*(undefined4 *)this) {
  case 0:
    __s = "null";
    break;
  case 1:
    pvVar3 = std::
             get<1ul,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)(this + 8));
    std::__cxx11::to_string(__return_storage_ptr__,*pvVar3);
    return __return_storage_ptr__;
  case 2:
    pvVar2 = std::
             get<2ul,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)(this + 8));
    __s = "false";
    if (*pvVar2 != false) {
      __s = "true";
    }
    break;
  case 3:
    std::any::
    any<punky::obj::Object_const&,punky::obj::Object,std::any::_Manager_external<punky::obj::Object>,void>
              (&local_50,(Object *)this);
    std::any_cast<punky::obj::Object>(&local_40,&local_50);
    inspect_abi_cxx11_(__return_storage_ptr__,(obj *)&local_40,obj_00);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)&local_40.m_value);
    std::any::reset(&local_50);
    return __return_storage_ptr__;
  case 4:
    pvVar1 = std::
             get<4ul,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)(this + 8));
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
    return __return_storage_ptr__;
  case 5:
    pvVar4 = std::
             get<5ul,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)(this + 8));
    (*(pvVar4->m_fn->super_ExprNode).super_AstNode._vptr_AstNode[3])(__return_storage_ptr__);
    return __return_storage_ptr__;
  case 6:
    __s = "";
    break;
  default:
    __s = "Default";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string inspect(const Object& obj)
{
    switch (obj.m_type)
    {
        case ObjectType::Int:
            return std::to_string(std::get<int>(obj.m_value));

        case ObjectType::Boolean:
            return std::get<bool>(obj.m_value) ? "true" : "false";

        case ObjectType::Return:
            return inspect(std::any_cast<Object>(obj));

        case ObjectType::Error:
            return std::get<std::string>(obj.m_value);

        case ObjectType::Function:
            return std::get<FunctionObject>(obj.m_value).fn()->to_string();

        case ObjectType::EmptyOut:
            return "";

        case ObjectType::Null:
            return "null";

        default:
            return "Default";
    }
}